

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

bool __thiscall ON_NurbsSurface::MakeNonRational(ON_NurbsSurface *this)

{
  bool bVar1;
  ON_BezierSurface local_38;
  
  if (this->m_is_rat == 0) {
    bVar1 = true;
  }
  else {
    ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
    ON_BezierSurface::ON_BezierSurface(&local_38);
    local_38.m_dim = this->m_dim;
    local_38.m_is_rat = this->m_is_rat;
    local_38.m_order[0] = this->m_cv_count[0];
    local_38.m_order[1] = this->m_cv_count[1];
    local_38.m_cv_stride = *&this->m_cv_stride;
    local_38.m_cv = this->m_cv;
    ON_BezierSurface::MakeNonRational(&local_38);
    this->m_is_rat = local_38.m_is_rat;
    *&this->m_cv_stride = local_38.m_cv_stride;
    this->m_cv = local_38.m_cv;
    local_38.m_cv = (double *)0x0;
    ON_BezierSurface::~ON_BezierSurface(&local_38);
    bVar1 = this->m_is_rat == 0;
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::IsRational() const
{
  return m_is_rat?true:false;
}